

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[2],kj::Repeat<char>&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],Repeat<char> *params_1)

{
  ArrayPtr<const_char> local_30;
  ArrayPtr<const_char> local_20;
  
  local_20 = toCharSequence<char_const(&)[2]>((char (*) [2])this);
  local_30.ptr._0_1_ = (*params)[0];
  local_30.size_ = *(size_t *)(params + 4);
  _::concat<kj::ArrayPtr<char_const>,kj::Repeat<char>>
            (__return_storage_ptr__,(_ *)&local_20,&local_30,(Repeat<char> *)local_30.size_);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}